

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O3

void flatbuffers::tests::Offset64Evolution(void)

{
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> OVar1;
  uint uVar2;
  uoffset_t uVar3;
  uint *puVar4;
  ulong uVar5;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> OVar6;
  ulong *puVar7;
  char *__function;
  uchar *v;
  pointer puVar8;
  Vector<unsigned_char,_unsigned_int> *pVVar9;
  Vector<unsigned_char,_unsigned_int> *pVVar10;
  int *piVar11;
  int *piVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> giant_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> big_data;
  FlatBufferBuilder builder;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  FlatBufferBuilderImpl<true> local_b0;
  
  local_b0.buf_.allocator_._0_4_ = 0x4030201;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_e0,__l,(allocator_type *)&local_c8);
  local_b0.buf_.allocator_ = (Allocator *)CONCAT35(local_b0.buf_.allocator_._5_3_,0xa09080706);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_c8,__l_00,(allocator_type *)&local_f8);
  local_b0.buf_.allocator_ = (Allocator *)0x0;
  local_b0.buf_.own_allocator_ = false;
  local_b0.buf_.initial_size_ = 0x400;
  local_b0.buf_.max_size_ = CONCAT44(local_b0.buf_.max_size_._4_4_,0x7fffffff);
  local_b0.buf_.buffer_minalign_ = 8;
  local_b0.buf_.reserved_ = 0;
  local_b0.buf_.size_ = (ulong)local_b0.buf_.size_._4_4_ << 0x20;
  local_b0.length_of_64_bit_region_ = 0;
  local_b0.nested = false;
  local_b0.finished = false;
  local_b0.buf_.buf_ = (uint8_t *)0x0;
  local_b0.buf_.cur_._0_6_ = 0;
  local_b0.buf_.cur_._6_2_ = 0;
  local_b0.buf_.scratch_._0_6_ = 0;
  local_b0._78_8_ = 0;
  local_b0.minalign_ = 1;
  local_b0.force_defaults_ = false;
  local_b0.dedup_vtables_ = true;
  local_b0.string_pool = (StringOffsetMap *)0x0;
  puVar8 = local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    puVar8 = &data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
              ::t;
  }
  OVar1 = FlatBufferBuilderImpl<false>::
          CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>
                    ((FlatBufferBuilderImpl<false> *)&local_b0,puVar8,
                     (long)local_e0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_e0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  FlatBufferBuilderImpl<false>::NotNested((FlatBufferBuilderImpl<false> *)&local_b0);
  local_b0.nested = true;
  uVar3 = (uoffset_t)local_b0.buf_.size_;
  FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>
            ((FlatBufferBuilderImpl<false> *)&local_b0,6,OVar1);
  uVar2 = FlatBufferBuilderImpl<false>::PushElement<float,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&local_b0,1234.0);
  FlatBufferBuilderImpl<false>::TrackField((FlatBufferBuilderImpl<false> *)&local_b0,4,uVar2);
  uVar3 = FlatBufferBuilderImpl<false>::EndTable((FlatBufferBuilderImpl<false> *)&local_b0,uVar3);
  FlatBufferBuilderImpl<false>::Finish
            ((FlatBufferBuilderImpl<false> *)&local_b0,uVar3,(char *)0x0,false);
  puVar4 = (uint *)FlatBufferBuilderImpl<false>::GetBufferPointer
                             ((FlatBufferBuilderImpl<false> *)&local_b0);
  if (puVar4 == (uint *)0x0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)((ulong)*puVar4 + (long)puVar4);
  }
  puVar4 = (uint *)FlatBufferBuilderImpl<false>::GetBufferPointer
                             ((FlatBufferBuilderImpl<false> *)&local_b0);
  if (puVar4 == (uint *)0x0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)((ulong)*puVar4 + (long)puVar4);
  }
  fVar15 = 0.0;
  fVar14 = 0.0;
  if ((4 < *(ushort *)((long)piVar12 - (long)*piVar12)) &&
     (uVar5 = (ulong)*(ushort *)((long)piVar12 + (4 - (long)*piVar12)), uVar5 != 0)) {
    fVar14 = *(float *)((long)piVar12 + uVar5);
  }
  if ((4 < *(ushort *)((long)piVar11 - (long)*piVar11)) &&
     (uVar5 = (ulong)*(ushort *)((long)piVar11 + (4 - (long)*piVar11)), uVar5 != 0)) {
    fVar15 = *(float *)((long)piVar11 + uVar5);
  }
  TestEq<float,float>(fVar14,fVar15,"\'v1_root->a()\' != \'v2_root->a()\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                      ,0xe2,"");
  if ((*(ushort *)((long)piVar12 - (long)*piVar12) < 7) ||
     (uVar5 = (ulong)*(ushort *)((long)piVar12 + (6 - (long)*piVar12)), uVar5 == 0)) {
    pVVar10 = (Vector<unsigned_char,_unsigned_int> *)0x0;
  }
  else {
    pVVar10 = (Vector<unsigned_char,_unsigned_int> *)
              ((long)piVar12 + *(uint *)((long)piVar12 + uVar5) + uVar5);
  }
  if ((*(ushort *)((long)piVar11 - (long)*piVar11) < 7) ||
     (uVar5 = (ulong)*(ushort *)((long)piVar11 + (6 - (long)*piVar11)), uVar5 == 0)) {
    pVVar9 = (Vector<unsigned_char,_unsigned_int> *)0x0;
  }
  else {
    pVVar9 = (Vector<unsigned_char,_unsigned_int> *)
             ((long)piVar11 + *(uint *)((long)piVar11 + uVar5) + uVar5);
  }
  TestEq<flatbuffers::Vector<unsigned_char,unsigned_int>const*,flatbuffers::Vector<unsigned_char,unsigned_int>const*>
            (pVVar10,pVVar9,"\'v1_root->b()\' != \'v2_root->b()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xe4,"");
  if ((*(ushort *)((long)piVar12 - (long)*piVar12) < 7) ||
     (uVar5 = (ulong)*(ushort *)((long)piVar12 + (6 - (long)*piVar12)), uVar5 == 0)) {
    puVar4 = (uint *)0x0;
  }
  else {
    puVar4 = (uint *)((long)piVar12 + *(uint *)((long)piVar12 + uVar5) + uVar5);
  }
  if (2 < *puVar4) {
    TestEq<unsigned_char,int>
              (*(uchar *)((long)puVar4 + 6),3,"\'v1_root->b()->Get(2)\' != \'3\'",
               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
               ,0xe5,"");
    if ((*(ushort *)((long)piVar11 - (long)*piVar11) < 7) ||
       (uVar5 = (ulong)*(ushort *)((long)piVar11 + (6 - (long)*piVar11)), uVar5 == 0)) {
      puVar4 = (uint *)0x0;
    }
    else {
      puVar4 = (uint *)((long)piVar11 + *(uint *)((long)piVar11 + uVar5) + uVar5);
    }
    if (2 < *puVar4) {
      TestEq<unsigned_char,int>
                (*(uchar *)((long)puVar4 + 6),3,"\'v2_root->b()->Get(2)\' != \'3\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                 ,0xe6,"");
      bVar13 = true;
      if (8 < *(ushort *)((long)piVar11 - (long)*piVar11)) {
        bVar13 = *(short *)((long)piVar11 + (8 - (long)*piVar11)) == 0;
      }
      TestEq<bool,bool>(true,bVar13,"\'true\' != \'v2_root->big_vector() == nullptr\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                        ,0xea,"");
      FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl
                ((FlatBufferBuilderImpl<false> *)&local_b0);
      local_b0.buf_.allocator_ = (Allocator *)0x0;
      local_b0.buf_.own_allocator_ = false;
      local_b0.buf_.initial_size_ = 0x400;
      local_b0.buf_.max_size_ = 0x7fffffffffffffff;
      local_b0.buf_.buffer_minalign_ = 8;
      local_b0.length_of_64_bit_region_ = 0;
      local_b0.nested = false;
      local_b0.finished = false;
      local_b0.buf_.reserved_ = 0;
      local_b0.buf_.size_ = 0;
      local_b0.buf_.buf_ = (uint8_t *)0x0;
      local_b0.buf_.cur_._0_6_ = 0;
      local_b0.buf_.cur_._6_2_ = 0;
      local_b0.buf_.scratch_._0_6_ = 0;
      local_b0._78_8_ = 0;
      local_b0.minalign_ = 1;
      local_b0.force_defaults_ = false;
      local_b0.dedup_vtables_ = true;
      local_b0.string_pool = (StringOffsetMap *)0x0;
      puVar8 = local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0) {
        puVar8 = &data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
                  ::t;
      }
      OVar6 = FlatBufferBuilderImpl<true>::
              CreateVector<unsigned_char,_flatbuffers::Offset64,_flatbuffers::Vector64>
                        (&local_b0,puVar8,
                         (long)local_c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      puVar8 = local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0) {
        puVar8 = &data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
                  ::t;
      }
      OVar1 = FlatBufferBuilderImpl<true>::
              CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>
                        (&local_b0,puVar8,
                         (long)local_e0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_e0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      FlatBufferBuilderImpl<true>::NotNested(&local_b0);
      local_b0.nested = true;
      uVar3 = (uoffset_t)local_b0.buf_.size_ - (int)local_b0.length_of_64_bit_region_;
      FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
                (&local_b0,8,OVar6);
      FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>
                (&local_b0,6,OVar1);
      uVar2 = FlatBufferBuilderImpl<true>::PushElement<float,unsigned_int>(&local_b0,1234.0);
      FlatBufferBuilderImpl<true>::TrackField(&local_b0,4,uVar2);
      uVar3 = FlatBufferBuilderImpl<true>::EndTable(&local_b0,uVar3);
      FlatBufferBuilderImpl<true>::Finish(&local_b0,uVar3,(char *)0x0,false);
      puVar4 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer(&local_b0);
      if (puVar4 == (uint *)0x0) {
        piVar12 = (int *)0x0;
      }
      else {
        piVar12 = (int *)((ulong)*puVar4 + (long)puVar4);
      }
      puVar4 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer(&local_b0);
      if (puVar4 == (uint *)0x0) {
        piVar11 = (int *)0x0;
      }
      else {
        piVar11 = (int *)((ulong)*puVar4 + (long)puVar4);
      }
      fVar15 = 0.0;
      fVar14 = 0.0;
      if ((4 < *(ushort *)((long)piVar12 - (long)*piVar12)) &&
         (uVar5 = (ulong)*(ushort *)((long)piVar12 + (4 - (long)*piVar12)), uVar5 != 0)) {
        fVar14 = *(float *)((long)piVar12 + uVar5);
      }
      if ((4 < *(ushort *)((long)piVar11 - (long)*piVar11)) &&
         (uVar5 = (ulong)*(ushort *)((long)piVar11 + (4 - (long)*piVar11)), uVar5 != 0)) {
        fVar15 = *(float *)((long)piVar11 + uVar5);
      }
      TestEq<float,float>(fVar14,fVar15,"\'v1_root->a()\' != \'v2_root->a()\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                          ,0xf9,"");
      if ((*(ushort *)((long)piVar12 - (long)*piVar12) < 7) ||
         (uVar5 = (ulong)*(ushort *)((long)piVar12 + (6 - (long)*piVar12)), uVar5 == 0)) {
        pVVar10 = (Vector<unsigned_char,_unsigned_int> *)0x0;
      }
      else {
        pVVar10 = (Vector<unsigned_char,_unsigned_int> *)
                  ((long)piVar12 + *(uint *)((long)piVar12 + uVar5) + uVar5);
      }
      if ((*(ushort *)((long)piVar11 - (long)*piVar11) < 7) ||
         (uVar5 = (ulong)*(ushort *)((long)piVar11 + (6 - (long)*piVar11)), uVar5 == 0)) {
        pVVar9 = (Vector<unsigned_char,_unsigned_int> *)0x0;
      }
      else {
        pVVar9 = (Vector<unsigned_char,_unsigned_int> *)
                 ((long)piVar11 + *(uint *)((long)piVar11 + uVar5) + uVar5);
      }
      TestEq<flatbuffers::Vector<unsigned_char,unsigned_int>const*,flatbuffers::Vector<unsigned_char,unsigned_int>const*>
                (pVVar10,pVVar9,"\'v1_root->b()\' != \'v2_root->b()\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                 ,0xfb,"");
      if ((*(ushort *)((long)piVar12 - (long)*piVar12) < 7) ||
         (uVar5 = (ulong)*(ushort *)((long)piVar12 + (6 - (long)*piVar12)), uVar5 == 0)) {
        puVar4 = (uint *)0x0;
      }
      else {
        puVar4 = (uint *)((long)piVar12 + *(uint *)((long)piVar12 + uVar5) + uVar5);
      }
      if (2 < *puVar4) {
        TestEq<unsigned_char,int>
                  (*(uchar *)((long)puVar4 + 6),3,"\'v1_root->b()->Get(2)\' != \'3\'",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                   ,0xfc,"");
        if ((*(ushort *)((long)piVar11 - (long)*piVar11) < 7) ||
           (uVar5 = (ulong)*(ushort *)((long)piVar11 + (6 - (long)*piVar11)), uVar5 == 0)) {
          puVar4 = (uint *)0x0;
        }
        else {
          puVar4 = (uint *)((long)piVar11 + *(uint *)((long)piVar11 + uVar5) + uVar5);
        }
        if (2 < *puVar4) {
          TestEq<unsigned_char,int>
                    (*(uchar *)((long)puVar4 + 6),3,"\'v2_root->b()->Get(2)\' != \'3\'",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                     ,0xfd,"");
          if (*(ushort *)((long)piVar11 - (long)*piVar11) < 9) {
            bVar13 = false;
          }
          else {
            bVar13 = *(short *)((long)piVar11 + (8 - (long)*piVar11)) != 0;
          }
          TestEq<bool,bool>(true,bVar13,"\'true\' != \'v2_root->big_vector() != nullptr\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                            ,0x101,"");
          uVar5 = (ulong)*(ushort *)((long)piVar11 + (8 - (long)*piVar11));
          TestEq<unsigned_long,unsigned_long>
                    (*(unsigned_long *)((long)piVar11 + *(long *)((long)piVar11 + uVar5) + uVar5),
                     (long)local_c8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_c8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     "\'v2_root->big_vector()->size()\' != \'big_data.size()\'",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                     ,0x102,"");
          if ((*(ushort *)((long)piVar11 - (long)*piVar11) < 9) ||
             (uVar5 = (ulong)*(ushort *)((long)piVar11 + (8 - (long)*piVar11)), uVar5 == 0)) {
            puVar7 = (ulong *)0x0;
          }
          else {
            puVar7 = (ulong *)((long)piVar11 + *(long *)((long)piVar11 + uVar5) + uVar5);
          }
          if (*puVar7 < 3) {
LAB_001aab0b:
            __function = 
            "return_type flatbuffers::Vector<unsigned char, unsigned long>::Get(SizeT) const [T = unsigned char, SizeT = unsigned long]"
            ;
            goto LAB_001aab20;
          }
          TestEq<unsigned_char,int>
                    (*(uchar *)((long)puVar7 + 10),8,"\'v2_root->big_vector()->Get(2)\' != \'8\'",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                     ,0x103,"");
          FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl(&local_b0);
          local_b0.buf_.allocator_ = (Allocator *)0x0;
          local_b0.buf_.own_allocator_ = false;
          local_b0.buf_.initial_size_ = 0x400;
          local_b0.buf_.max_size_ = 0x7fffffffffffffff;
          local_b0.buf_.buffer_minalign_ = 8;
          local_b0.length_of_64_bit_region_ = 0;
          local_b0.nested = false;
          local_b0.finished = false;
          local_b0.buf_.reserved_ = 0;
          local_b0.buf_.size_ = 0;
          local_b0.buf_.buf_ = (uint8_t *)0x0;
          local_b0.buf_.cur_._0_6_ = 0;
          local_b0.buf_.cur_._6_2_ = 0;
          local_b0.buf_.scratch_._0_6_ = 0;
          local_b0._78_8_ = 0;
          local_b0.minalign_ = 1;
          local_b0.force_defaults_ = false;
          local_b0.dedup_vtables_ = true;
          local_b0.string_pool = (StringOffsetMap *)0x0;
          local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (uchar *)0x0;
          local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_f8,8);
          local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[2] = '*';
          puVar8 = local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start == 0) {
            puVar8 = &data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
                      ::t;
          }
          OVar6 = FlatBufferBuilderImpl<true>::
                  CreateVector<unsigned_char,_flatbuffers::Offset64,_flatbuffers::Vector64>
                            (&local_b0,puVar8,
                             (long)local_f8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_f8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          v = &data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
               ::t;
          if ((long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0) {
            v = local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
          }
          OVar1 = FlatBufferBuilderImpl<true>::
                  CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>
                            (&local_b0,v,
                             (long)local_e0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_e0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          FlatBufferBuilderImpl<true>::NotNested(&local_b0);
          local_b0.nested = true;
          uVar3 = (uoffset_t)local_b0.buf_.size_ - (int)local_b0.length_of_64_bit_region_;
          FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
                    (&local_b0,8,OVar6);
          FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>
                    (&local_b0,6,OVar1);
          uVar2 = FlatBufferBuilderImpl<true>::PushElement<float,unsigned_int>(&local_b0,1234.0);
          FlatBufferBuilderImpl<true>::TrackField(&local_b0,4,uVar2);
          uVar3 = FlatBufferBuilderImpl<true>::EndTable(&local_b0,uVar3);
          FlatBufferBuilderImpl<true>::Finish(&local_b0,uVar3,(char *)0x0,false);
          puVar4 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer(&local_b0);
          if (puVar4 == (uint *)0x0) {
            piVar12 = (int *)0x0;
          }
          else {
            piVar12 = (int *)((ulong)*puVar4 + (long)puVar4);
          }
          puVar4 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer(&local_b0);
          if (puVar4 == (uint *)0x0) {
            piVar11 = (int *)0x0;
          }
          else {
            piVar11 = (int *)((ulong)*puVar4 + (long)puVar4);
          }
          fVar15 = 0.0;
          fVar14 = 0.0;
          if ((4 < *(ushort *)((long)piVar12 - (long)*piVar12)) &&
             (uVar5 = (ulong)*(ushort *)((long)piVar12 + (4 - (long)*piVar12)), uVar5 != 0)) {
            fVar14 = *(float *)((long)piVar12 + uVar5);
          }
          if ((4 < *(ushort *)((long)piVar11 - (long)*piVar11)) &&
             (uVar5 = (ulong)*(ushort *)((long)piVar11 + (4 - (long)*piVar11)), uVar5 != 0)) {
            fVar15 = *(float *)((long)piVar11 + uVar5);
          }
          TestEq<float,float>(fVar14,fVar15,"\'v1_root->a()\' != \'v2_root->a()\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                              ,0x118,"");
          if ((*(ushort *)((long)piVar12 - (long)*piVar12) < 7) ||
             (uVar5 = (ulong)*(ushort *)((long)piVar12 + (6 - (long)*piVar12)), uVar5 == 0)) {
            pVVar10 = (Vector<unsigned_char,_unsigned_int> *)0x0;
          }
          else {
            pVVar10 = (Vector<unsigned_char,_unsigned_int> *)
                      ((long)piVar12 + *(uint *)((long)piVar12 + uVar5) + uVar5);
          }
          if ((*(ushort *)((long)piVar11 - (long)*piVar11) < 7) ||
             (uVar5 = (ulong)*(ushort *)((long)piVar11 + (6 - (long)*piVar11)), uVar5 == 0)) {
            pVVar9 = (Vector<unsigned_char,_unsigned_int> *)0x0;
          }
          else {
            pVVar9 = (Vector<unsigned_char,_unsigned_int> *)
                     ((long)piVar11 + *(uint *)((long)piVar11 + uVar5) + uVar5);
          }
          TestEq<flatbuffers::Vector<unsigned_char,unsigned_int>const*,flatbuffers::Vector<unsigned_char,unsigned_int>const*>
                    (pVVar10,pVVar9,"\'v1_root->b()\' != \'v2_root->b()\'",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                     ,0x11a,"");
          if ((*(ushort *)((long)piVar12 - (long)*piVar12) < 7) ||
             (uVar5 = (ulong)*(ushort *)((long)piVar12 + (6 - (long)*piVar12)), uVar5 == 0)) {
            puVar4 = (uint *)0x0;
          }
          else {
            puVar4 = (uint *)((long)piVar12 + *(uint *)((long)piVar12 + uVar5) + uVar5);
          }
          if (2 < *puVar4) {
            TestEq<unsigned_char,int>
                      (*(uchar *)((long)puVar4 + 6),3,"\'v1_root->b()->Get(2)\' != \'3\'",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                       ,0x11b,"");
            if ((*(ushort *)((long)piVar11 - (long)*piVar11) < 7) ||
               (uVar5 = (ulong)*(ushort *)((long)piVar11 + (6 - (long)*piVar11)), uVar5 == 0)) {
              puVar4 = (uint *)0x0;
            }
            else {
              puVar4 = (uint *)((long)piVar11 + *(uint *)((long)piVar11 + uVar5) + uVar5);
            }
            if (2 < *puVar4) {
              TestEq<unsigned_char,int>
                        (*(uchar *)((long)puVar4 + 6),3,"\'v2_root->b()->Get(2)\' != \'3\'",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                         ,0x11c,"");
              if (*(ushort *)((long)piVar11 - (long)*piVar11) < 9) {
                bVar13 = false;
              }
              else {
                bVar13 = *(short *)((long)piVar11 + (8 - (long)*piVar11)) != 0;
              }
              TestEq<bool,bool>(true,bVar13,"\'true\' != \'v2_root->big_vector() != nullptr\'",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                                ,0x120,"");
              uVar5 = (ulong)*(ushort *)((long)piVar11 + (8 - (long)*piVar11));
              TestEq<unsigned_long,unsigned_long>
                        (*(unsigned_long *)
                          ((long)piVar11 + *(long *)((long)piVar11 + uVar5) + uVar5),
                         (long)local_f8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_f8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                         "\'v2_root->big_vector()->size()\' != \'giant_data.size()\'",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                         ,0x121,"");
              if ((*(ushort *)((long)piVar11 - (long)*piVar11) < 9) ||
                 (uVar5 = (ulong)*(ushort *)((long)piVar11 + (8 - (long)*piVar11)), uVar5 == 0)) {
                puVar7 = (ulong *)0x0;
              }
              else {
                puVar7 = (ulong *)((long)piVar11 + *(long *)((long)piVar11 + uVar5) + uVar5);
              }
              if (2 < *puVar7) {
                TestEq<unsigned_char,int>
                          (*(uchar *)((long)puVar7 + 10),0x2a,
                           "\'v2_root->big_vector()->Get(2)\' != \'42\'",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                           ,0x122,"");
                if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (uchar *)0x0) {
                  operator_delete(local_f8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_f8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_f8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl(&local_b0);
                if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (uchar *)0x0) {
                  operator_delete(local_c8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_c8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_c8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (uchar *)0x0) {
                  operator_delete(local_e0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_e0.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_e0.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                return;
              }
              goto LAB_001aab0b;
            }
          }
        }
      }
    }
  }
  __function = 
  "return_type flatbuffers::Vector<unsigned char>::Get(SizeT) const [T = unsigned char, SizeT = unsigned int]"
  ;
LAB_001aab20:
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                ,0xc1,__function);
}

Assistant:

void Offset64Evolution() {
  // Some common data for the tests.
  const std::vector<uint8_t> data = { 1, 2, 3, 4 };
  const std::vector<uint8_t> big_data = { 6, 7, 8, 9, 10 };

  // Built V1 read V2
  {
    // Use the 32-bit builder since V1 doesn't have any 64-bit offsets.
    FlatBufferBuilder builder;

    builder.Finish(v1::CreateRootTableDirect(builder, 1234, &data));

    // Use each version to get a view at the root table.
    auto v1_root = v1::GetRootTable(builder.GetBufferPointer());
    auto v2_root = v2::GetRootTable(builder.GetBufferPointer());

    // Test field equivalents for fields common to V1 and V2.
    TEST_EQ(v1_root->a(), v2_root->a());

    TEST_EQ(v1_root->b(), v2_root->b());
    TEST_EQ(v1_root->b()->Get(2), 3);
    TEST_EQ(v2_root->b()->Get(2), 3);

    // This field is added in V2, so it should be null since V1 couldn't have
    // written it.
    TEST_ASSERT(v2_root->big_vector() == nullptr);
  }

  // Built V2 read V1
  {
    // Use the 64-bit builder since V2 has 64-bit offsets.
    FlatBufferBuilder64 builder;

    builder.Finish(v2::CreateRootTableDirect(builder, 1234, &data, &big_data));

    // Use each version to get a view at the root table.
    auto v1_root = v1::GetRootTable(builder.GetBufferPointer());
    auto v2_root = v2::GetRootTable(builder.GetBufferPointer());

    // Test field equivalents for fields common to V1 and V2.
    TEST_EQ(v1_root->a(), v2_root->a());

    TEST_EQ(v1_root->b(), v2_root->b());
    TEST_EQ(v1_root->b()->Get(2), 3);
    TEST_EQ(v2_root->b()->Get(2), 3);

    // Test that V2 can read the big vector, which V1 doesn't even have
    // accessors for (i.e. v1_root->big_vector() doesn't exist).
    TEST_ASSERT(v2_root->big_vector() != nullptr);
    TEST_EQ(v2_root->big_vector()->size(), big_data.size());
    TEST_EQ(v2_root->big_vector()->Get(2), 8);
  }

  // Built V2 read V1, bigger than max 32-bit buffer sized.
  // This checks that even a large buffer can still be read by V1.
  {
    // Use the 64-bit builder since V2 has 64-bit offsets.
    FlatBufferBuilder64 builder;

    std::vector<uint8_t> giant_data;
    giant_data.resize(1LL << 3);
    giant_data[2] = 42;

    builder.Finish(
        v2::CreateRootTableDirect(builder, 1234, &data, &giant_data));

    // Use each version to get a view at the root table.
    auto v1_root = v1::GetRootTable(builder.GetBufferPointer());
    auto v2_root = v2::GetRootTable(builder.GetBufferPointer());

    // Test field equivalents for fields common to V1 and V2.
    TEST_EQ(v1_root->a(), v2_root->a());

    TEST_EQ(v1_root->b(), v2_root->b());
    TEST_EQ(v1_root->b()->Get(2), 3);
    TEST_EQ(v2_root->b()->Get(2), 3);

    // Test that V2 can read the big vector, which V1 doesn't even have
    // accessors for (i.e. v1_root->big_vector() doesn't exist).
    TEST_ASSERT(v2_root->big_vector() != nullptr);
    TEST_EQ(v2_root->big_vector()->size(), giant_data.size());
    TEST_EQ(v2_root->big_vector()->Get(2), 42);
  }
}